

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
TargetArtifactBase::GetTarget
          (TargetArtifactBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *pcVar3;
  string *this_01;
  string name;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  bVar1 = cmGeneratorExpression::IsValidTargetName(&local_40);
  if (bVar1) {
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_40);
    if (this_00 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,content);
      std::operator+(&local_60,"No target \"",&local_40);
      std::operator+(&local_a0,&local_60,"\"");
      reportError(context,&local_80,&local_a0);
    }
    else {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (((int)TVar2 < 4) ||
         (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == UNKNOWN_LIBRARY)) {
        if ((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
           ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(dagChecker,this_00),
            !bVar1 && ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker),
                       !bVar1 || (pcVar3 = cmGeneratorExpressionDAGChecker::TopTarget(dagChecker),
                                 this_00 != pcVar3)))))) goto LAB_003134c1;
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,
                   "Expressions which require the linker language may not be used while evaluating link libraries"
                   ,(allocator<char> *)&local_60);
        reportError(context,&local_80,&local_a0);
        goto LAB_003133fe;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,content);
      std::operator+(&local_60,"Target \"",&local_40);
      std::operator+(&local_a0,&local_60,"\" is not an executable or library.");
      reportError(context,&local_80,&local_a0);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    this_01 = &local_60;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Expression syntax not recognized.",(allocator<char> *)&local_60)
    ;
    reportError(context,&local_80,&local_a0);
LAB_003133fe:
    this_01 = &local_a0;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&local_80);
  this_00 = (cmGeneratorTarget *)0x0;
LAB_003134c1:
  std::__cxx11::string::~string((string *)&local_40);
  return this_00;
}

Assistant:

cmGeneratorTarget* GetTarget(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const
  {
    // Lookup the referenced target.
    std::string name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return nullptr;
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return nullptr;
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return nullptr;
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return nullptr;
    }

    return target;
  }